

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O3

timediff_t Curl_timediff(curltime newer,curltime older)

{
  timediff_t tVar1;
  long lVar2;
  
  tVar1 = 0x7fffffffffffffff;
  lVar2 = newer.tv_sec - older.tv_sec;
  if (lVar2 < 0x20c49ba5e353f7) {
    if (lVar2 < -0x20c49ba5e353f6) {
      return -0x7fffffffffffffff;
    }
    tVar1 = (long)((newer.tv_usec - older.tv_usec) / 1000) + lVar2 * 1000;
  }
  return tVar1;
}

Assistant:

timediff_t Curl_timediff(struct curltime newer, struct curltime older)
{
  timediff_t diff = newer.tv_sec-older.tv_sec;
  if(diff >= (TIME_MAX/1000))
    return TIME_MAX;
  else if(diff <= (TIME_MIN/1000))
    return TIME_MIN;
  return diff * 1000 + (newer.tv_usec-older.tv_usec)/1000;
}